

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O1

SymbolEntry * __thiscall
Scope::queryProperties(Scope *this,Address *addr,int4 size,Address *usepoint,uint4 *flags)

{
  SymbolEntry *pSVar1;
  Scope *pSVar2;
  uint *puVar3;
  uint uVar4;
  SymbolEntry *res;
  SymbolEntry *local_38;
  
  local_38 = (SymbolEntry *)0x0;
  pSVar2 = Database::mapScope(this->glb->symboltab,this,addr,usepoint);
  pSVar2 = stackContainer(pSVar2,(Scope *)0x0,addr,size,usepoint,&local_38);
  pSVar1 = local_38;
  if (local_38 == (SymbolEntry *)0x0) {
    if (pSVar2 == (Scope *)0x0) {
      puVar3 = partmap<Address,_unsigned_int>::getValue(&this->glb->symboltab->flagbase,addr);
      uVar4 = *puVar3;
    }
    else {
      *flags = 0x410000;
      *flags = (uint)(pSVar2->fd == (Funcdata *)0x0) << 0xf | 0x410000;
      puVar3 = partmap<Address,_unsigned_int>::getValue(&this->glb->symboltab->flagbase,addr);
      uVar4 = *flags | *puVar3;
    }
  }
  else {
    uVar4 = local_38->symbol->flags | local_38->extraflags;
  }
  *flags = uVar4;
  return pSVar1;
}

Assistant:

SymbolEntry *Scope::queryProperties(const Address &addr,int4 size,
				    const Address &usepoint,uint4 &flags) const
{
  SymbolEntry *res = (SymbolEntry *)0;
  const Scope *basescope = glb->symboltab->mapScope(this,addr,usepoint);
  const Scope *finalscope = stackContainer(basescope,(const Scope *)0,addr,size,usepoint,&res);
  if (res != (SymbolEntry *)0) // If we found a symbol
    flags = res->getAllFlags(); // use its flags
  else if (finalscope != (Scope *)0) { // If we found just a scope
    // set flags just based on scope
    flags = Varnode::mapped | Varnode::addrtied;
    if (finalscope->isGlobal())
      flags |= Varnode::persist;
    flags |= glb->symboltab->getProperty(addr);
  }
  else
    flags = glb->symboltab->getProperty(addr);
  return res;
}